

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O3

ion_status_t oafh_get(ion_file_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  int iVar1;
  ion_err_t iVar2;
  undefined8 in_RAX;
  ion_status_t iVar3;
  int loc;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar2 = oafh_find_item_loc(hash_map,key,&local_14);
  iVar3.error = '\x01';
  iVar3._1_3_ = 0;
  iVar3.count = 0;
  if (iVar2 == '\0') {
    iVar1 = (hash_map->super).record.key_size;
    fseek((FILE *)hash_map->file,
          (long)(iVar1 + (iVar1 + 1 + (hash_map->super).record.value_size) * local_14 + 1),0);
    fread(value,(long)(hash_map->super).record.value_size,1,(FILE *)hash_map->file);
    iVar3.error = '\0';
    iVar3._1_3_ = 0;
    iVar3.count = 1;
  }
  return iVar3;
}

Assistant:

ion_status_t
oafh_get(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key,
	ion_value_t			value
) {
	int loc;

	if (oafh_find_item_loc(hash_map, key, &loc) == err_ok) {
#if ION_DEBUG
		printf("Item found at location %d\n", loc);
#endif

		int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

		/* set file position */
		fseek(hash_map->file, (loc * record_size) + SIZEOF(STATUS) + hash_map->super.record.key_size, SEEK_SET);
#if ION_DEBUG
		printf("seeking %i\n", (loc * record_size) + SIZEOF(STATUS) + hash_map->super.record.key_size);
#endif
		fread(value, hash_map->super.record.value_size, 1, hash_map->file);

		return ION_STATUS_OK(1);
	}
	else {
#if ION_DEBUG
		printf("Item not found in hash table.\n");
#endif
		value = NULL;	/*et the number of bytes to 0 */
		return ION_STATUS_ERROR(err_item_not_found);
	}
}